

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dumper.c
# Opt level: O0

void yaml_emitter_delete_document_and_anchors(yaml_emitter_t *emitter)

{
  int local_78 [2];
  yaml_node_t node;
  int index;
  yaml_emitter_t *emitter_local;
  
  if (emitter->anchors == (yaml_anchors_t *)0x0) {
    yaml_document_delete(emitter->document);
    emitter->document = (yaml_document_t *)0x0;
  }
  else {
    for (node.end_mark.column._4_4_ = 0;
        (emitter->document->nodes).start + node.end_mark.column._4_4_ <
        (emitter->document->nodes).top; node.end_mark.column._4_4_ = node.end_mark.column._4_4_ + 1)
    {
      memcpy(local_78,(emitter->document->nodes).start + node.end_mark.column._4_4_,0x60);
      if ((emitter->anchors[node.end_mark.column._4_4_].serialized == 0) &&
         (yaml_free((void *)node._0_8_), local_78[0] == 1)) {
        yaml_free(node.tag);
      }
      if (local_78[0] == 2) {
        yaml_free(node.tag);
        node.data.scalar.value = (yaml_char_t *)0x0;
        node.data.scalar.length = 0;
        node.tag = (yaml_char_t *)0x0;
      }
      if (local_78[0] == 3) {
        yaml_free(node.tag);
        node.data.scalar.value = (yaml_char_t *)0x0;
        node.data.scalar.length = 0;
        node.tag = (yaml_char_t *)0x0;
      }
    }
    yaml_free((emitter->document->nodes).start);
    (emitter->document->nodes).end = (yaml_node_t *)0x0;
    (emitter->document->nodes).top = (yaml_node_t *)0x0;
    (emitter->document->nodes).start = (yaml_node_t *)0x0;
    yaml_free(emitter->anchors);
    emitter->anchors = (yaml_anchors_t *)0x0;
    emitter->last_anchor_id = 0;
    emitter->document = (yaml_document_t *)0x0;
  }
  return;
}

Assistant:

static void
yaml_emitter_delete_document_and_anchors(yaml_emitter_t *emitter)
{
    int index;

    if (!emitter->anchors) {
        yaml_document_delete(emitter->document);
        emitter->document = NULL;
        return;
    }

    for (index = 0; emitter->document->nodes.start + index
            < emitter->document->nodes.top; index ++) {
        yaml_node_t node = emitter->document->nodes.start[index];
        if (!emitter->anchors[index].serialized) {
            yaml_free(node.tag);
            if (node.type == YAML_SCALAR_NODE) {
                yaml_free(node.data.scalar.value);
            }
        }
        if (node.type == YAML_SEQUENCE_NODE) {
            STACK_DEL(emitter, node.data.sequence.items);
        }
        if (node.type == YAML_MAPPING_NODE) {
            STACK_DEL(emitter, node.data.mapping.pairs);
        }
    }

    STACK_DEL(emitter, emitter->document->nodes);
    yaml_free(emitter->anchors);

    emitter->anchors = NULL;
    emitter->last_anchor_id = 0;
    emitter->document = NULL;
}